

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::stmt_skip_peek_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  string local_168;
  byte local_141;
  string local_140;
  byte local_11c;
  byte local_11b;
  byte local_11a;
  byte local_119;
  string local_118;
  byte local_f6;
  byte local_f5;
  byte local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint32_t local_1c;
  InputAPI *pIStack_18;
  uint32_t ind_local;
  InputAPI *this_local;
  
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  local_11c = 0;
  local_141 = 0;
  local_1c = ind;
  pIStack_18 = this;
  this_local = (InputAPI *)__return_storage_ptr__;
  if (this->type_ == DEFAULT) {
    indent_abi_cxx11_(&local_e0,(re2c *)(ulong)ind,ind);
    local_e1 = 1;
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_c0,&local_e0,&poVar1->yych);
    local_f5 = 1;
    std::operator+(&local_a0,&local_c0," = ");
    local_f6 = 1;
    Opt::yychConversion_abi_cxx11_(&local_118,(Opt *)&opts);
    local_119 = 1;
    std::operator+(&local_80,&local_a0,&local_118);
    local_11a = 1;
    std::operator+(&local_60,&local_80,"*++");
    local_11b = 1;
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_40,&local_60,&poVar1->yycursor);
    local_11c = 1;
    std::operator+(__return_storage_ptr__,&local_40,";\n");
  }
  else {
    stmt_skip_abi_cxx11_(&local_140,this,ind);
    local_141 = 1;
    stmt_peek_abi_cxx11_(&local_168,this,local_1c);
    std::operator+(__return_storage_ptr__,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  if ((local_141 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_140);
  }
  if ((local_11c & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_11b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((local_11a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_119 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_118);
  }
  if ((local_f6 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_f5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((local_e1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_skip_peek (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yych + " = " + opts.yychConversion () + "*++" + opts->yycursor + ";\n"
		: stmt_skip (ind) + stmt_peek (ind);
}